

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  _Bool _Var2;
  uint8_t uVar3;
  char *pcVar4;
  uint32_t *pixel_data;
  char cVar5;
  cpu_registers registers;
  cpu_registers local_30;
  
  if (argc < 2) {
    pcVar4 = "ERROR: No game path given. First argument should be game file path";
  }
  else {
    game_file = argv[1];
    pcVar4 = getenv("DEBUG");
    _Var1 = init_SDL();
    if (_Var1) {
      printf("ERROR: Failed to init SDL");
      goto LAB_00108486;
    }
    _Var1 = load_rom(game_file,pcVar4 != (char *)0x0);
    if (!_Var1) {
      cold_boot_init(&local_30);
      init_ppu();
      init_RAM();
      init_VRAM();
      if (pcVar4 != (char *)0x0) {
        open_cpu_debug_logfile();
      }
      _Var1 = false;
      pixel_data = get_pixel_data_ptr();
      do {
        _Var2 = get_NMI_flag();
        uVar3 = execute_interpreter_cycle(&local_30,_Var2);
        if (uVar3 != '\0') {
          cVar5 = uVar3 * -3;
          _Var2 = _Var1;
          do {
            _Var1 = run_PPU_cycle();
            if ((_Var1) && (_Var2 == false)) {
              render_frame(pixel_data);
              update_controller_states();
            }
            cVar5 = cVar5 + '\x01';
            _Var2 = _Var1;
          } while (cVar5 != '\0');
        }
        _Var2 = should_quit();
      } while (!_Var2);
      cleanup_PRG_and_CHR_banks();
      puts("Ending Emulation!");
      exit_SDL();
      close_cpu_debug_logfile();
      return 0;
    }
    pcVar4 = "FATAL ERROR occurred while attempting to load game.";
  }
  puts(pcVar4);
LAB_00108486:
  exit(1);
}

Assistant:

static void parse_cmdline(int argc, char **argv) {
    if(argc < 2) {
        printf("ERROR: No game path given. First argument should be game file path\n");
        exit(1);
    }
    game_file = argv[1];
}